

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AviWriter.cpp
# Opt level: O1

int64_t __thiscall AviWriter::TellFile64(AviWriter *this,FILE *fid)

{
  __off_t _Var1;
  
  if (fid != (FILE *)0x0) {
    clearerr((FILE *)fid);
    fflush((FILE *)fid);
    _Var1 = ftello((FILE *)fid);
    return _Var1;
  }
  return -1;
}

Assistant:

int64_t AviWriter::TellFile64(FILE *fid)
{
    if (fid == NULL) return -1;

    clearerr(fid);
    fflush(fid);
#if (defined(__WIN32__) || defined(_WIN32)) && !defined(_WIN32_WCE)
    return _telli64(_fileno(fid));
#else
#if defined(_WIN32_WCE)
    return ftell(fid);
#else
    return ftello(fid);
#endif
#endif
}